

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_SubDEdgeChainHistoryValue::ReportHelper(ON_SubDEdgeChainHistoryValue *this,ON_TextLog *text_log)

{
  uint uVar1;
  ON_SubDEdgeChain *this_00;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  ON_TextLog::Print(text_log,"SubD edge chain value\n");
  ON_TextLog::PushIndent(text_log);
  uVar1 = (this->m_value).m_count;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    this_00 = (this->m_value).m_a[uVar3];
    if (this_00 != (ON_SubDEdgeChain *)0x0) {
      ON_SubDEdgeChain::Dump(this_00,text_log);
    }
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_SubDEdgeChainHistoryValue::ReportHelper(ON_TextLog& text_log) const
{
  text_log.Print("SubD edge chain value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for (i = 0; i < count; i++)
  {
    if( nullptr != m_value[i])
      m_value[i]->Dump(text_log);
  }
  text_log.PopIndent();
  return true;
}